

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvscsu.cpp
# Opt level: O0

int getDynamicOffset(uint32_t c,uint32_t *pOffset)

{
  int local_1c;
  int i;
  uint32_t *pOffset_local;
  uint32_t c_local;
  
  local_1c = 0;
  while( true ) {
    if (6 < local_1c) {
      if (c < 0x80) {
        pOffset_local._4_4_ = 0xffffffff;
      }
      else if (((c < 0x3400) || (c - 0x10000 < 0x4000)) || (c - 0x1d000 < 0x3000)) {
        *pOffset = c & 0x7fffff80;
        pOffset_local._4_4_ = c >> 7;
      }
      else if (((c < 0xe000) || (c == 0xfeff)) || (0xffef < c)) {
        pOffset_local._4_4_ = 0xffffffff;
      }
      else {
        *pOffset = c & 0x7fffff80;
        pOffset_local._4_4_ = c - 0xac00 >> 7;
      }
      return pOffset_local._4_4_;
    }
    if (c - fixedOffsets[local_1c] < 0x80) break;
    local_1c = local_1c + 1;
  }
  *pOffset = fixedOffsets[local_1c];
  return local_1c + 0xf9;
}

Assistant:

static int
getDynamicOffset(uint32_t c, uint32_t *pOffset) {
    int i;

    for(i=0; i<7; ++i) {
        if((uint32_t)(c-fixedOffsets[i])<=0x7f) {
            *pOffset=fixedOffsets[i];
            return 0xf9+i;
        }
    }

    if(c<0x80) {
        /* No dynamic window for US-ASCII. */
        return -1;
    } else if(c<0x3400 ||
              (uint32_t)(c-0x10000)<(0x14000-0x10000) ||
              (uint32_t)(c-0x1d000)<=(0x1ffff-0x1d000)
    ) {
        /* This character is in a code range for a "small", i.e., reasonably windowable, script. */
        *pOffset=c&0x7fffff80;
        return (int)(c>>7);
    } else if(0xe000<=c && c!=0xfeff && c<0xfff0) {
        /* For these characters we need to take the gapOffset into account. */
        *pOffset=c&0x7fffff80;
        return (int)((c-gapOffset)>>7);
    } else {
        return -1;
    }
}